

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::initPrecompiledKernelOverrides(CLIntercept *this,cl_context context)

{
  size_t sVar1;
  int iVar2;
  cl_int cVar3;
  mapped_type *ppSVar4;
  mapped_type pSVar5;
  cl_program p_Var6;
  void *pvVar7;
  char *__s;
  size_t sVar8;
  cl_kernel p_Var9;
  undefined8 uVar10;
  ulong uVar11;
  CPrecompiledKernelOverridesMap *this_00;
  pthread_mutex_t *__mutex;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  cl_int errorCode;
  cl_uint numDevices;
  size_t buildLogSize;
  size_t programStringLength;
  char *pProgramString;
  cl_int local_94;
  pthread_mutex_t *local_90;
  uint local_84;
  cl_context local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  size_t local_58;
  mapped_type local_50;
  undefined1 *local_48;
  char *local_40;
  CPrecompiledKernelOverridesMap *local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_80 = context;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Initializing precompiled kernel overrides...\n","");
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    local_94 = 0;
    this_00 = &this->m_PrecompiledKernelOverridesMap;
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
              ::operator[](this_00,&local_80);
    pSVar5 = *ppSVar4;
    if (pSVar5 != (mapped_type)0x0) {
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferBytes);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInts);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInt4s);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInt16s);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DFloat);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DInt);
      local_94 = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DUInt);
      local_94 = (*(this->m_Dispatch).clReleaseProgram)(pSVar5->Program);
      operator_delete(pSVar5);
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                ::operator[](this_00,&local_80);
      *ppSVar4 = (mapped_type)0x0;
    }
    pSVar5 = (mapped_type)operator_new(0x40);
    pSVar5->Kernel_CopyImage2Dto2DInt = (cl_kernel)0x0;
    pSVar5->Kernel_CopyImage2Dto2DUInt = (cl_kernel)0x0;
    pSVar5->Kernel_CopyBufferUInt16s = (cl_kernel)0x0;
    pSVar5->Kernel_CopyImage2Dto2DFloat = (cl_kernel)0x0;
    pSVar5->Kernel_CopyBufferUInts = (cl_kernel)0x0;
    pSVar5->Kernel_CopyBufferUInt4s = (cl_kernel)0x0;
    pSVar5->Program = (cl_program)0x0;
    pSVar5->Kernel_CopyBufferBytes = (cl_kernel)0x0;
    local_40 = (char *)0x0;
    local_48 = (undefined1 *)0x0;
    if (local_94 == 0) {
      local_40 = &_binary_kernels_precompiled_kernels_cl_start;
      local_48 = &_binary_kernels_precompiled_kernels_cl_size;
      p_Var6 = (*(this->m_Dispatch).clCreateProgramWithSource)
                         (local_80,1,&local_40,(size_t *)&local_48,&local_94);
      pSVar5->Program = p_Var6;
    }
    if ((local_94 == 0) &&
       (local_94 = (*(this->m_Dispatch).clBuildProgram)
                             (pSVar5->Program,0,(cl_device_id *)0x0,(char *)0x0,
                              (_func_void_cl_program_void_ptr *)0x0,(void *)0x0), local_94 != 0)) {
      local_84 = 0;
      local_90 = __mutex;
      local_38 = this_00;
      (*(this->m_Dispatch).clGetContextInfo)(local_80,0x1083,4,&local_84,(size_t *)0x0);
      this_00 = local_38;
      __mutex = local_90;
      if ((ulong)local_84 != 0) {
        uVar11 = (ulong)local_84 << 3;
        pvVar7 = operator_new__(uVar11);
        cVar3 = (*(this->m_Dispatch).clGetContextInfo)(local_80,0x1081,uVar11,pvVar7,(size_t *)0x0);
        this_00 = local_38;
        __mutex = local_90;
        if ((cVar3 == 0) && (local_84 != 0)) {
          uVar11 = 0;
          local_50 = pSVar5;
          do {
            local_58 = 0;
            (*(this->m_Dispatch).clGetProgramBuildInfo)
                      (local_50->Program,*(cl_device_id *)((long)pvVar7 + uVar11 * 8),0x1183,0,
                       (void *)0x0,&local_58);
            sVar1 = local_58;
            __s = (char *)operator_new__(local_58 + 1);
            (*(this->m_Dispatch).clGetProgramBuildInfo)
                      (local_50->Program,*(cl_device_id *)((long)pvVar7 + uVar11 * 8),0x1183,sVar1,
                       __s,(size_t *)0x0);
            __s[local_58] = '\0';
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,"-------> Start of Build Log:\n","");
            log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            local_78[0] = local_68;
            sVar8 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_78,__s,__s + sVar8);
            log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,"<------- End of Build Log!\n","");
            log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            operator_delete__(__s);
            uVar11 = uVar11 + 1;
            pSVar5 = local_50;
            this_00 = local_38;
            __mutex = local_90;
          } while (uVar11 < local_84);
        }
      }
    }
    if ((((this->m_Config).OverrideReadBuffer != false) ||
        ((this->m_Config).OverrideWriteBuffer != false)) ||
       ((this->m_Config).OverrideCopyBuffer == true)) {
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)(pSVar5->Program,"CopyBufferBytes",&local_94);
        pSVar5->Kernel_CopyBufferBytes = p_Var9;
      }
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)(pSVar5->Program,"CopyBufferUInts",&local_94);
        pSVar5->Kernel_CopyBufferUInts = p_Var9;
      }
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)(pSVar5->Program,"CopyBufferUInt4s",&local_94);
        pSVar5->Kernel_CopyBufferUInt4s = p_Var9;
      }
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)(pSVar5->Program,"CopyBufferUInt16s",&local_94)
        ;
        pSVar5->Kernel_CopyBufferUInt16s = p_Var9;
      }
    }
    if ((((this->m_Config).OverrideReadImage != false) ||
        ((this->m_Config).OverrideWriteImage != false)) ||
       ((this->m_Config).OverrideCopyImage == true)) {
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)
                           (pSVar5->Program,"CopyImage2Dto2DFloat",&local_94);
        pSVar5->Kernel_CopyImage2Dto2DFloat = p_Var9;
      }
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)
                           (pSVar5->Program,"CopyImage2Dto2DInt",&local_94);
        pSVar5->Kernel_CopyImage2Dto2DInt = p_Var9;
      }
      if (local_94 == 0) {
        p_Var9 = (*(this->m_Dispatch).clCreateKernel)
                           (pSVar5->Program,"CopyImage2Dto2DUInt",&local_94);
        pSVar5->Kernel_CopyImage2Dto2DUInt = p_Var9;
      }
    }
    if (local_94 == 0) {
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                ::operator[](this_00,&local_80);
      *ppSVar4 = pSVar5;
    }
    else {
      operator_delete(pSVar5);
    }
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"... precompiled kernel override initialization complete.\n","");
    log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar10 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock(local_90);
  _Unwind_Resume(uVar10);
}

Assistant:

void CLIntercept::initPrecompiledKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing precompiled kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SPrecompiledKernelOverrides*    pOverrides =
        m_PrecompiledKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferBytes );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInts );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt4s );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt16s );

        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DFloat );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DInt );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DUInt );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_PrecompiledKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SPrecompiledKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_CopyBufferBytes = NULL;
        pOverrides->Kernel_CopyBufferUInts = NULL;
        pOverrides->Kernel_CopyBufferUInt4s = NULL;
        pOverrides->Kernel_CopyBufferUInt16s = NULL;

        pOverrides->Kernel_CopyImage2Dto2DFloat = NULL;
        pOverrides->Kernel_CopyImage2Dto2DInt = NULL;
        pOverrides->Kernel_CopyImage2Dto2DUInt = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the precompiled kernel string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetPrecompiledKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                NULL,
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( config().OverrideReadBuffer ||
            config().OverrideWriteBuffer ||
            config().OverrideCopyBuffer )
        {
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferBytes = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferBytes",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInts = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInts",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt4s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt4s",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt16s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt16s",
                    &errorCode );
            }
        }

        if( config().OverrideReadImage ||
            config().OverrideWriteImage ||
            config().OverrideCopyImage )
        {
            // TODO: Check to see if images are supported?
            //       What should happen if this is a multiple-device context,
            //       and one device supports images, but another doesn't?

            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DFloat = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DFloat",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DInt",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DUInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DUInt",
                    &errorCode );
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            m_PrecompiledKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... precompiled kernel override initialization complete.\n" );
}